

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateImplementation.cpp
# Opt level: O2

bool Js::DateImplementation::TryParseDecimalDigits
               (char16 *str,size_t length,size_t startIndex,size_t numDigits,int *value)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  size_t sVar7;
  
  if (str == (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                ,0x297,"(str)","str");
    if (!bVar2) goto LAB_00a18ddf;
    *puVar3 = 0;
  }
  if (length == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                ,0x298,"(length)","length");
    if (!bVar2) goto LAB_00a18ddf;
    *puVar3 = 0;
  }
  if (length < startIndex) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                ,0x299,"(startIndex <= length)","startIndex <= length");
    if (!bVar2) goto LAB_00a18ddf;
    *puVar3 = 0;
  }
  if (8 < numDigits - 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                ,0x29a,"(numDigits != 0 && numDigits <= 9)",
                                "numDigits != 0 && numDigits <= 9");
    if (!bVar2) goto LAB_00a18ddf;
    *puVar3 = 0;
  }
  if (length - startIndex < numDigits) {
LAB_00a18cf9:
    bVar2 = false;
  }
  else {
    uVar4 = 0;
    do {
      uVar5 = uVar4;
      if (str[startIndex + uVar4] != L'0') break;
      uVar4 = uVar4 + 1;
      uVar5 = numDigits + (numDigits == 0);
    } while (uVar4 < numDigits);
    sVar7 = numDigits;
    if (numDigits < uVar5) {
      sVar7 = uVar5;
    }
    iVar6 = 0;
    for (uVar4 = uVar5; uVar4 < numDigits; uVar4 = uVar4 + 1) {
      if (9 < (ushort)(str[startIndex + uVar4] + L'￐')) goto LAB_00a18cf9;
      iVar6 = (uint)(ushort)(str[startIndex + uVar4] + L'￐') + iVar6 * 10;
    }
    if (numDigits < uVar5) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                  ,0x2af,"(i == numDigits)","i == numDigits");
      if (!bVar2) {
LAB_00a18ddf:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    *value = iVar6;
    bVar2 = true;
    if (sVar7 < length - startIndex) {
      bVar2 = (ushort)(str[sVar7 + startIndex] + L'ￆ') < 0xfff6;
    }
  }
  return bVar2;
}

Assistant:

bool DateImplementation::TryParseDecimalDigits(
        const char16 *const str,
        const size_t length,
        const size_t startIndex,
        const size_t numDigits,
        int &value)
    {
        Assert(str);
        Assert(length);
        Assert(startIndex <= length);
        Assert(numDigits != 0 && numDigits <= 9); // will fit in an 'int'

        if(numDigits > length - startIndex)
            return false;

        size_t i = 0;

        // Skip leading zeroes
        while(str[startIndex + i] == _u('0') && ++i < numDigits);

        // Parse remaining digits
        int v = 0;
        for(; i < numDigits; ++i)
        {
            const unsigned short d = str[startIndex + i] - _u('0');
            if(d > 9)
                break;
            v = v * 10 + d;
        }
        if(i < numDigits)
            return false;
        Assert(i == numDigits);
        value = v;

        // The next character must not be a digit
        return !(i < length - startIndex && static_cast<unsigned short>(str[startIndex + i] - _u('0')) <= 9);
    }